

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::importRelative(ModuleImpl *this,StringPtr importPath)

{
  String *pSVar1;
  ReadableDirectory *dir;
  size_t sVar2;
  size_t in_RCX;
  char *pcVar3;
  PathPtr path;
  StringPtr path_00;
  StringPtr pathText;
  PathPtr path_01;
  Path local_68;
  ArrayPtr<const_kj::String> local_50;
  PathPtr local_40;
  
  pathText.content.ptr = (char *)importPath.content.size_;
  pcVar3 = importPath.content.ptr;
  if ((in_RCX == 1) || (*pathText.content.ptr != '/')) {
    dir = *(ReadableDirectory **)(pcVar3 + 8);
    pSVar1 = *(String **)(pcVar3 + 0x20);
    local_40.parts.ptr = *(String **)(pcVar3 + 0x28);
    local_40.parts.size_ = *(size_t *)(pcVar3 + 0x30);
    local_50 = (ArrayPtr<const_kj::String>)kj::PathPtr::parent(&local_40);
    pathText.content.size_ = in_RCX;
    kj::PathPtr::eval(&local_68,(PathPtr *)&local_50,pathText);
    path_01.parts.size_ = (size_t)local_68.parts.ptr;
    path_01.parts.ptr = pSVar1;
    Impl::loadModule((Impl *)this,dir,path_01);
    sVar2 = local_68.parts.size_;
    pSVar1 = local_68.parts.ptr;
    if (local_68.parts.ptr != (String *)0x0) {
      local_68.parts.ptr = (String *)0x0;
      local_68.parts.size_ = 0;
      (**(local_68.parts.disposer)->_vptr_ArrayDisposer)
                (local_68.parts.disposer,pSVar1,0x18,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  else {
    pSVar1 = *(String **)(pcVar3 + 8);
    path_00.content.size_ = in_RCX;
    path_00.content.ptr = (char *)(in_RCX - 1);
    kj::Path::parse(&local_68,(Path *)(pathText.content.ptr + 1),path_00);
    path.parts.size_ = (size_t)local_68.parts.ptr;
    path.parts.ptr = pSVar1;
    Impl::loadModuleFromSearchPath((Impl *)this,path);
    sVar2 = local_68.parts.size_;
    pSVar1 = local_68.parts.ptr;
    if (local_68.parts.ptr != (String *)0x0) {
      local_68.parts.ptr = (String *)0x0;
      local_68.parts.size_ = 0;
      (**(local_68.parts.disposer)->_vptr_ArrayDisposer)
                (local_68.parts.disposer,pSVar1,0x18,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
}

Assistant:

kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    if (importPath.size() > 0 && importPath[0] == '/') {
      return loader.loadModuleFromSearchPath(kj::Path::parse(importPath.slice(1)));
    } else {
      return loader.loadModule(sourceDir, path.parent().eval(importPath));
    }
  }